

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O0

int curl_formget(curl_httppost *form,void *arg,curl_formget_callback append)

{
  size_t sVar1;
  curl_read_callback p_Var2;
  curl_read_callback p_Var3;
  size_t sVar4;
  undefined1 local_2070 [8];
  Form temp;
  size_t nread;
  char buffer [8192];
  FormData *ptr;
  FormData *data;
  curl_off_t size;
  curl_formget_callback p_Stack_28;
  CURLcode result;
  curl_formget_callback append_local;
  void *arg_local;
  curl_httppost *form_local;
  
  p_Stack_28 = append;
  append_local = (curl_formget_callback)arg;
  arg_local = form;
  form_local._4_4_ = Curl_getformdata((Curl_easy *)0x0,&ptr,form,(char *)0x0,(curl_off_t *)&data);
  if (form_local._4_4_ == CURLE_OK) {
    size._4_4_ = 0;
    for (buffer._8184_8_ = ptr; buffer._8184_8_ != 0;
        buffer._8184_8_ = *(undefined8 *)buffer._8184_8_) {
      if ((*(int *)(buffer._8184_8_ + 8) == 4) || (*(int *)(buffer._8184_8_ + 8) == 3)) {
        Curl_FormInit((Form *)local_2070,(FormData *)buffer._8184_8_);
        do {
          p_Var2 = (curl_read_callback)readfromfile((Form *)local_2070,(char *)&nread,0x2000);
          temp.fread_func = p_Var2;
          if (((p_Var2 == (curl_read_callback)0xffffffffffffffff) ||
              ((curl_read_callback)0x2000 < p_Var2)) ||
             (p_Var3 = (curl_read_callback)(*p_Stack_28)(append_local,(char *)&nread,(size_t)p_Var2)
             , p_Var2 != p_Var3)) {
            if (temp.sent != 0) {
              fclose((FILE *)temp.sent);
            }
            Curl_formclean(&ptr);
            return -1;
          }
        } while (temp.fread_func != (curl_read_callback)0x0);
      }
      else {
        sVar1 = *(size_t *)(buffer._8184_8_ + 0x18);
        sVar4 = (*p_Stack_28)(append_local,*(char **)(buffer._8184_8_ + 0x10),
                              *(size_t *)(buffer._8184_8_ + 0x18));
        if (sVar1 != sVar4) {
          Curl_formclean(&ptr);
          return -1;
        }
      }
    }
    Curl_formclean(&ptr);
    form_local._4_4_ = CURLE_OK;
  }
  return form_local._4_4_;
}

Assistant:

int curl_formget(struct curl_httppost *form, void *arg,
                 curl_formget_callback append)
{
  CURLcode result;
  curl_off_t size;
  struct FormData *data, *ptr;

  result = Curl_getformdata(NULL, &data, form, NULL, &size);
  if(result)
    return (int)result;

  for(ptr = data; ptr; ptr = ptr->next) {
    if((ptr->type == FORM_FILE) || (ptr->type == FORM_CALLBACK)) {
      char buffer[8192];
      size_t nread;
      struct Form temp;

      Curl_FormInit(&temp, ptr);

      do {
        nread = readfromfile(&temp, buffer, sizeof(buffer));
        if((nread == (size_t) -1) ||
           (nread > sizeof(buffer)) ||
           (nread != append(arg, buffer, nread))) {
          if(temp.fp)
            fclose(temp.fp);
          Curl_formclean(&data);
          return -1;
        }
      } while(nread);
    }
    else {
      if(ptr->length != append(arg, ptr->line, ptr->length)) {
        Curl_formclean(&data);
        return -1;
      }
    }
  }
  Curl_formclean(&data);
  return 0;
}